

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<6>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<6> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  int *piVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong *puVar4;
  uint32_t *puVar5;
  pointer puVar6;
  pointer puVar7;
  uint *puVar8;
  pointer pvVar9;
  bool bVar10;
  byte bVar11;
  uint32_t uVar12;
  _Elt_pointer pDVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar20;
  int iVar21;
  VectorUint32 *levels;
  RAnsBitDecoder *this_00;
  bool bVar22;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>_>
  status_stack;
  bool local_dd;
  uint local_dc;
  DecodingStatus local_d8;
  uint32_t local_cc;
  long local_c8;
  DecodingStatus local_bc;
  ulong local_b0;
  ulong local_a8;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_a0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
  local_98;
  ulong local_48;
  RAnsBitDecoder *local_40;
  DirectBitDecoder *local_38;
  
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  local_cc = num_points;
  local_a0 = oit;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
             (ulong)this->dimension_,&local_d8.num_remaining_points,(allocator_type *)&local_bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_98);
  if (local_98._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_98._M_impl.super__Deque_impl_data._M_map,
                    (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_98._M_impl.super__Deque_impl_data._M_map);
  }
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
             (ulong)this->dimension_,&local_d8.num_remaining_points,(allocator_type *)&local_bc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_98._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_98._M_impl.super__Deque_impl_data._M_map,
                    (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_98._M_impl.super__Deque_impl_data._M_map);
  }
  local_bc.num_remaining_points = local_cc;
  local_bc.last_axis = 0;
  local_bc.stack_pos = 0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
  ::_M_initialize_map(&local_98,0);
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>>
                *)&local_98,&local_bc);
  }
  else {
    (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_bc.stack_pos;
    (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_bc.num_remaining_points;
    (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_bc.last_axis;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_dd = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (!local_dd) {
    local_40 = (RAnsBitDecoder *)&this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    do {
      pDVar13 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar13 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
      }
      uVar16 = pDVar13[-1].num_remaining_points;
      uVar12 = pDVar13[-1].last_axis;
      uVar15 = (ulong)pDVar13[-1].stack_pos;
      if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_98._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_98._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_98._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      local_dc = 1;
      if (uVar16 <= local_cc) {
        pvVar20 = (this->base_stack_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar15;
        levels = (this->levels_stack_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar15;
        local_b0 = uVar15;
        uVar12 = GetAxis(this,uVar16,levels,uVar12);
        if (uVar12 < this->dimension_) {
          local_a8 = (ulong)uVar12;
          uVar2 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[local_a8];
          if (this->bit_length_ == uVar2) {
            if (uVar16 == 0) {
              local_dc = 0;
            }
            else {
              local_dc = 0;
              do {
                puVar4 = (ulong *)(pvVar20->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
                local_d8._0_8_ = *puVar4;
                local_d8.stack_pos = (uint32_t)puVar4[1];
                std::
                vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                ::emplace_back<draco::VectorD<unsigned_int,3>>
                          ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                            *)(local_a0->oit_).container,(VectorD<unsigned_int,_3> *)&local_d8);
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
            }
          }
          else if (uVar16 < 3) {
            puVar5 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            *puVar5 = uVar12;
            uVar15 = (ulong)this->dimension_;
            if (1 < this->dimension_) {
              uVar12 = *puVar5;
              uVar14 = 1;
              do {
                bVar22 = uVar12 == (int)uVar15 - 1U;
                uVar12 = uVar12 + 1;
                if (bVar22) {
                  uVar12 = 0;
                }
                puVar5[uVar14] = uVar12;
                uVar14 = uVar14 + 1;
                uVar15 = (ulong)this->dimension_;
              } while (uVar14 < uVar15);
            }
            if (uVar16 != 0) {
              uVar12 = 0;
              do {
                bVar22 = this->dimension_ != 0;
                local_dc = 0xd;
                if (bVar22) {
                  uVar15 = 0;
                  do {
                    puVar6 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar7 = (this->axes_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar6[puVar7[uVar15]] = 0;
                    uVar3 = puVar7[uVar15];
                    iVar18 = this->bit_length_ -
                             (levels->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar3];
                    if ((iVar18 != 0) &&
                       (bVar10 = DirectBitDecoder::DecodeLeastSignificantBits32
                                           (local_38,iVar18,puVar6 + uVar3), !bVar10)) {
                      local_dc = 1;
                      goto LAB_0015f94c;
                    }
                    uVar3 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar15];
                    puVar8 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + uVar3;
                    *puVar8 = *puVar8 | (pvVar20->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar3];
                    uVar15 = uVar15 + 1;
                    bVar22 = uVar15 < this->dimension_;
                  } while (bVar22);
                  local_dc = 0xd;
                }
LAB_0015f94c:
                if (bVar22) goto LAB_0015f98d;
                puVar4 = (ulong *)(this->p_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                local_d8._0_8_ = *puVar4;
                local_d8.stack_pos = (uint32_t)puVar4[1];
                std::
                vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                ::emplace_back<draco::VectorD<unsigned_int,3>>
                          ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                            *)(local_a0->oit_).container,(VectorD<unsigned_int,_3> *)&local_d8);
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar16);
            }
            local_dc = 10;
LAB_0015f98d:
            if (local_dc == 10) {
              local_dc = 0;
            }
          }
          else if (this->num_decoded_points_ <= this->num_points_) {
            local_c8 = CONCAT44(local_c8._4_4_,this->bit_length_);
            uVar15 = (ulong)((int)local_b0 + 1);
            local_48 = uVar15;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((this->base_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar15,pvVar20);
            piVar1 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_a8 * 4);
            *piVar1 = *piVar1 + (1 << ((char)local_c8 + ~(byte)uVar2 & 0x1f));
            uVar3 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            uVar19 = 0;
            local_c8 = uVar15 * 3;
            if (uVar3 != 0) {
              uVar14 = (ulong)uVar3;
              uVar19 = 0;
              this_00 = local_40;
              do {
                bVar22 = RAnsBitDecoder::DecodeNextBit(this_00);
                uVar19 = (uint)bVar22 + uVar19 * 2;
                this_00 = this_00 + 1;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            uVar15 = local_b0;
            iVar18 = (uVar16 >> 1) - uVar19;
            if (uVar19 <= uVar16 >> 1) {
              iVar17 = uVar16 - iVar18;
              iVar21 = iVar18;
              if (iVar18 != iVar17) {
                puVar8 = (this->half_decoder_).pos_._M_current;
                if (puVar8 == (this->half_decoder_).bits_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                  bVar11 = 0;
                }
                else {
                  uVar16 = (this->half_decoder_).num_used_bits_;
                  bVar11 = (byte)((*puVar8 << ((byte)uVar16 & 0x1f)) >> 0x1f);
                  uVar16 = uVar16 + 1;
                  (this->half_decoder_).num_used_bits_ = uVar16;
                  if (uVar16 == 0x20) {
                    (this->half_decoder_).pos_._M_current = puVar8 + 1;
                    (this->half_decoder_).num_used_bits_ = 0;
                  }
                }
                if (bVar11 == 0) {
                  iVar21 = iVar17;
                  iVar17 = iVar18;
                }
              }
              pvVar9 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar20 = pvVar9 + local_b0;
              puVar6 = (pvVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_a8;
              *puVar6 = *puVar6 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar9->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_c8 * 8),pvVar20);
              if (iVar21 != 0) {
                local_d8.last_axis = uVar12;
                local_d8.num_remaining_points = iVar21;
                local_d8.stack_pos = (uint32_t)uVar15;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
                            *)&local_98,&local_d8);
              }
              local_dc = 0;
              if (iVar17 != 0) {
                local_d8.last_axis = uVar12;
                local_d8.num_remaining_points = iVar17;
                local_d8.stack_pos = (uint32_t)local_48;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
                            *)&local_98,&local_d8);
              }
            }
          }
        }
      }
    } while (((local_dc & 0xd) == 0) &&
            (local_dd = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_98._M_impl.super__Deque_impl_data._M_start._M_cur, !local_dd));
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<6>::DecodingStatus>_>
  ::~_Deque_base(&local_98);
  return local_dd;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}